

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O0

string * __thiscall
sago::PlatformFolders::getSaveGamesFolder1_abi_cxx11_
          (string *__return_storage_ptr__,PlatformFolders *this)

{
  PlatformFolders *this_local;
  
  getDataHome_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

std::string PlatformFolders::getSaveGamesFolder1() const {
#ifdef _WIN32
	//A dedicated Save Games folder was not introduced until Vista. For XP and older save games are most often saved in a normal folder named "My Games".
	//Data that should not be user accessible should be placed under GetDataHome() instead
	return GetKnownWindowsFolder(FOLDERID_Documents, "Failed to find My Documents folder")+"\\My Games";
#elif defined(__APPLE__)
	return sago::internal::getHome()+"/Library/Application Support";
#else
	return getDataHome();
#endif
}